

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::toLowerInPlace(string *s)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  size_type sVar4;
  
  sVar1 = s->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (s->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar4]);
      pcVar2[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return;
}

Assistant:

Not( Not const& other ) : m_matcher( other.m_matcher ) {}